

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManage.cpp
# Opt level: O1

void test_print_module(void)

{
  ModuleStruct *pMVar1;
  
  pMVar1 = module_head;
  puts("-------module link-------");
  if (pMVar1 != (ModuleStruct *)0x0) {
    do {
      printf("id: %d\n",(ulong)pMVar1->id);
      printf("cs: %d\n",(ulong)pMVar1->cs_seg);
      printf("ds: %d\n",(ulong)pMVar1->ds_seg);
      printf("name: %s\n",pMVar1->name);
      putchar(10);
      pMVar1 = pMVar1->next;
    } while (pMVar1 != (ModuleStruct *)0x0);
  }
  return;
}

Assistant:

void test_print_module() {
	ModuleStruct *temp=module_head;
	printf("-------module link-------\n");
	while (temp)
	{
		printf("id: %d\n",temp->id);
		printf("cs: %d\n", temp->cs_seg);
		printf("ds: %d\n", temp->ds_seg);
		printf("name: %s\n", temp->name);
		printf("\n");
		temp = temp->next;
	}
}